

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O2

void cftfsub(size_t n,float *a,float *w)

{
  undefined8 uVar1;
  ulong l;
  ulong uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (n < 9) {
    l = 2;
  }
  else {
    cft1st(n,a,w);
    l = 8;
    while (l * 4 < n) {
      cftmdl(n,l,a,w);
      l = l * 4;
    }
  }
  if (l * 4 - n == 0) {
    for (uVar2 = 0; uVar2 < l; uVar2 = uVar2 + 2) {
      fVar7 = (float)*(undefined8 *)(a + uVar2);
      fVar8 = (float)((ulong)*(undefined8 *)(a + uVar2) >> 0x20);
      fVar11 = (float)*(undefined8 *)(a + l + uVar2);
      fVar5 = fVar7 + fVar11;
      fVar3 = (float)((ulong)*(undefined8 *)(a + l + uVar2) >> 0x20);
      fVar6 = fVar8 + fVar3;
      fVar7 = fVar7 - fVar11;
      fVar8 = fVar8 - fVar3;
      fVar11 = (float)*(undefined8 *)(a + l * 2 + uVar2);
      fVar12 = (float)((ulong)*(undefined8 *)(a + l * 2 + uVar2) >> 0x20);
      fVar9 = (float)*(undefined8 *)(a + l * 3 + uVar2);
      fVar3 = fVar11 - fVar9;
      fVar10 = (float)((ulong)*(undefined8 *)(a + l * 3 + uVar2) >> 0x20);
      fVar4 = fVar12 - fVar10;
      fVar11 = fVar11 + fVar9;
      fVar12 = fVar12 + fVar10;
      *(ulong *)(a + uVar2) = CONCAT44(fVar6 + fVar12,fVar5 + fVar11);
      *(ulong *)(a + l * 2 + uVar2) = CONCAT44(fVar6 - fVar12,fVar5 - fVar11);
      a[l + uVar2] = fVar7 - fVar4;
      a[l + uVar2 + 1] = fVar8 + fVar3;
      a[l * 3 + uVar2] = fVar4 + fVar7;
      a[l * 3 + uVar2 + 1] = fVar8 - fVar3;
    }
  }
  else {
    for (uVar2 = 0; uVar2 < l; uVar2 = uVar2 + 2) {
      uVar1 = *(undefined8 *)(a + l + uVar2);
      fVar11 = (float)*(undefined8 *)(a + uVar2);
      fVar3 = (float)((ulong)*(undefined8 *)(a + uVar2) >> 0x20);
      fVar12 = (float)uVar1;
      a[uVar2] = fVar12 + fVar11;
      a[uVar2 + 1] = fVar3 + a[l + uVar2 + 1];
      *(ulong *)(a + l + uVar2) = CONCAT44(fVar3 - (float)((ulong)uVar1 >> 0x20),fVar11 - fVar12);
    }
  }
  return;
}

Assistant:

static void cftfsub(size_t n, float *a, float *w) {
    size_t j, j1, j2, j3, l;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i - x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i + x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i - x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = a[j + 1] - a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] += a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}